

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O1

void __thiscall
DatalogDatabase::fixed_point
          (DatalogDatabase *this,vector<int,_std::allocator<int>_> *rule_inds,ostream *out)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = totalTuples(this);
  if (iVar1 != -1) {
    do {
      piVar3 = (rule_inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((rule_inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_finish != piVar3) {
        uVar4 = 0;
        do {
          evaluateRule(this,(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[piVar3[uVar4]],out);
          uVar4 = uVar4 + 1;
          piVar3 = (rule_inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)(rule_inds->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2
                                ));
      }
      iVar2 = totalTuples(this);
      bVar5 = iVar2 != iVar1;
      iVar1 = iVar2;
    } while (bVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void DatalogDatabase::fixed_point(vector<int> rule_inds, ostream &out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rule_inds.size(); k++)
    {
      evaluateRule(rules[rule_inds[k]], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }
  out << endl;
}